

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall embree::Application::Application(Application *this,int features)

{
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  atomic<unsigned_long> *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  double dVar5;
  undefined1 *puVar6;
  long lVar7;
  CommandLineOption *pCVar8;
  mapped_type *pmVar9;
  runtime_error *this_01;
  Ref<embree::CommandLineParser::CommandLineOption> closure;
  value_type local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  key_type local_80;
  string local_60;
  CommandLineParser *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_Application = (_func_int **)&PTR__Application_002c6c40;
  local_38 = &(this->rtcore).field_2;
  (this->rtcore)._M_dataplus._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->rtcore,"");
  this->verbosity = 0;
  this->features = features;
  local_40 = &this->commandLineParser;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  (this->commandLineParser).verbosity = NORMAL;
  this->log_delta = false;
  dVar5 = getSeconds();
  this->start_time = dVar5;
  this->last_time = dVar5;
  this->last_virtual_memory = 0;
  this->last_resident_memory = 0;
  if (instance == (Application *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    instance = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"help","");
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"--help: prints help for all supported command line options","");
    lVar7 = local_98;
    puVar6 = local_a0;
    pCVar8 = (CommandLineOption *)operator_new(0x38);
    paVar2 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
    (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
    (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
    (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6c78;
    pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
    LOCK();
    paVar3 = &(pCVar8->super_RefCount).refCounter;
    (paVar3->super___atomic_base<unsigned_long>)._M_i =
         (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    local_a8.ptr = pCVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    std::
    vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
    ::push_back(&local_40->commandLineOptionList,&local_a8);
    this_00 = &(this->commandLineParser).commandLineOptionMap;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
             ::operator[](this_00,&local_80);
    if (local_a8.ptr != (CommandLineOption *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    if (pmVar9->ptr != (CommandLineOption *)0x0) {
      (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar9->ptr = local_a8.ptr;
    if (local_a8.ptr != (CommandLineOption *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((features & 1U) != 0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"rtcore","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--rtcore <string>: uses <string> to configure Embree device",
                 "");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6cc8;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"threads","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--threads <int>: number of threads to use","");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6d18;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"affinity","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--affinity: affinitize threads","");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6d68;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"set_affinity","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "--set_affinity <0/1>: enables or disables affinitizing of threads","");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6db8;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      paVar4 = &local_80.field_2;
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar4) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"set_affinity","");
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"set-affinity","");
      CommandLineParser::registerOptionAlias(local_40,&local_60,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar4) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"start_threads","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "--start_threads <0/1>: starts threads at device creation time if set to 1","");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6e08;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      paVar4 = &local_80.field_2;
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar4) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"start_threads","");
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"start-threads","");
      CommandLineParser::registerOptionAlias(local_40,&local_60,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar4) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"verbose","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--verbose <int>: sets verbosity level","");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6e58;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"delta","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"--delta: print delta numbers in log","");
      lVar7 = local_98;
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + lVar7);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6ea8;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"isa","");
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "--isa <string>: selects instruction set to use:\n  sse: select SSE codepath\n  sse2: select SSE2 codepath\n  sse3: select SSE3 codepath\n  ssse3: select SSSE3 codepath\n  sse4.1: select SSE4.1 codepath\n  sse4.2: select SSE4.2 codepath\n  avx: select AVX codepath\n  avxi: select AVXI codepath\n  avx2: select AVX2 codepath\n  avx512: select AVX512 codepath\n"
                 ,"");
      puVar6 = local_a0;
      pCVar8 = (CommandLineOption *)operator_new(0x38);
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,puVar6,puVar6 + local_98);
      (pCVar8->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c4af8;
      (pCVar8->description)._M_dataplus._M_p = (pointer)&(pCVar8->description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pCVar8->description,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      (pCVar8->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__CommandLineOption_002c6ef8;
      pCVar8[1].super_RefCount._vptr_RefCount = (_func_int **)this;
      LOCK();
      paVar3 = &(pCVar8->super_RefCount).refCounter;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      local_a8.ptr = pCVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::
      vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
      ::push_back(&local_40->commandLineOptionList,&local_a8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
               ::operator[](this_00,&local_80);
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      if (pmVar9->ptr != (CommandLineOption *)0x0) {
        (*(pmVar9->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar9->ptr = local_a8.ptr;
      if (local_a8.ptr != (CommandLineOption *)0x0) {
        (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"internal error: application already created");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Application::Application(int features)
    : rtcore(""), verbosity(0),
      features((Features)features),
      log_delta(false),
      start_time(getSeconds()),
      last_time(start_time),
      last_virtual_memory(0),
      last_resident_memory(0)
  {
    if (instance)
      throw std::runtime_error("internal error: application already created");

    instance = this;

    registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");

    if (features & FEATURE_RTCORE)
    {
      registerOption("rtcore", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += "," + cin->getString();
        }, "--rtcore <string>: uses <string> to configure Embree device");
    
      registerOption("threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",threads=" + toString(cin->getInt());
        }, "--threads <int>: number of threads to use");

      registerOption("affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=1";
        }, "--affinity: affinitize threads");

      registerOption("set_affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=" + cin->getString();
        }, "--set_affinity <0/1>: enables or disables affinitizing of threads");
      registerOptionAlias("set_affinity","set-affinity");

      registerOption("start_threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",start_threads=" + cin->getString();
        }, "--start_threads <0/1>: starts threads at device creation time if set to 1");
      registerOptionAlias("start_threads","start-threads");
      
      registerOption("verbose", [this] (Ref<ParseStream> cin, const FileName& path) {
          verbosity = cin->getInt();
          rtcore += ",verbose=" + toString(verbosity);
        }, "--verbose <int>: sets verbosity level");

      registerOption("delta", [this] (Ref<ParseStream> cin, const FileName& path) {
          log_delta = true;
        }, "--delta: print delta numbers in log");
      
      registerOption("isa", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",isa=" + cin->getString();
        }, "--isa <string>: selects instruction set to use:\n"
        "  sse: select SSE codepath\n"
        "  sse2: select SSE2 codepath\n"
        "  sse3: select SSE3 codepath\n"
        "  ssse3: select SSSE3 codepath\n"
        "  sse4.1: select SSE4.1 codepath\n"
        "  sse4.2: select SSE4.2 codepath\n"
        "  avx: select AVX codepath\n"
        "  avxi: select AVXI codepath\n"
        "  avx2: select AVX2 codepath\n"
        "  avx512: select AVX512 codepath\n");
    } 
  }